

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void jsonParseReset(JsonParse *pParse)

{
  undefined8 *in_RDI;
  
  if (*(char *)(in_RDI + 6) != '\0') {
    sqlite3RCStrUnref(pParse);
    in_RDI[2] = 0;
    *(undefined4 *)(in_RDI + 4) = 0;
    *(undefined1 *)(in_RDI + 6) = 0;
  }
  if (*(int *)((long)in_RDI + 0xc) != 0) {
    sqlite3DbFree((sqlite3 *)pParse,in_RDI);
    *in_RDI = 0;
    *(undefined4 *)(in_RDI + 1) = 0;
    *(undefined4 *)((long)in_RDI + 0xc) = 0;
  }
  return;
}

Assistant:

static void jsonParseReset(JsonParse *pParse){
  assert( pParse->nJPRef<=1 );
  if( pParse->bJsonIsRCStr ){
    sqlite3RCStrUnref(pParse->zJson);
    pParse->zJson = 0;
    pParse->nJson = 0;
    pParse->bJsonIsRCStr = 0;
  }
  if( pParse->nBlobAlloc ){
    sqlite3DbFree(pParse->db, pParse->aBlob);
    pParse->aBlob = 0;
    pParse->nBlob = 0;
    pParse->nBlobAlloc = 0;
  }
}